

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall
wallet::CWallet::SetMinVersion(CWallet *this,WalletFeature nVersion,WalletBatch *batch_in)

{
  long lVar1;
  void *pvVar2;
  void *in_RDX;
  int in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  WalletBatch *batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  WalletDatabase *in_stack_ffffffffffffff70;
  CWallet *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffa0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffffa8;
  WalletFeature *in_stack_ffffffffffffffb0;
  CWallet *in_stack_ffffffffffffffb8;
  ConstevalFormatString<1U> in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),in_RDI,
             (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
  if (*(int *)(in_RDI + 0x40) < in_ESI) {
    WalletLogPrintf<wallet::WalletFeature>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffb0);
    *(int *)(in_RDI + 0x40) = in_ESI;
    pvVar2 = in_RDX;
    if (in_RDX == (void *)0x0) {
      pvVar2 = operator_new(0x10);
      in_stack_ffffffffffffff78 = (CWallet *)GetDatabase(in_stack_ffffffffffffff78);
      WalletBatch::WalletBatch
                ((WalletBatch *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 (bool)in_stack_ffffffffffffff6f);
    }
    if (40000 < *(int *)(in_RDI + 0x40)) {
      WalletBatch::WriteMinVersion
                ((WalletBatch *)in_stack_ffffffffffffff70,
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    }
    if ((in_RDX == (void *)0x0) && (pvVar2 != (void *)0x0)) {
      WalletBatch::~WalletBatch
                ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      operator_delete(pvVar2,0x10);
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWallet::SetMinVersion(enum WalletFeature nVersion, WalletBatch* batch_in)
{
    LOCK(cs_wallet);
    if (nWalletVersion >= nVersion)
        return;
    WalletLogPrintf("Setting minversion to %d\n", nVersion);
    nWalletVersion = nVersion;

    {
        WalletBatch* batch = batch_in ? batch_in : new WalletBatch(GetDatabase());
        if (nWalletVersion > 40000)
            batch->WriteMinVersion(nWalletVersion);
        if (!batch_in)
            delete batch;
    }
}